

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.cc
# Opt level: O2

bool ssl::initialize(void)

{
  pointer pbVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  char *__s;
  undefined8 uVar4;
  pointer __lhs;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator<char> local_11e;
  allocator<char> local_11d;
  allocator_type local_11c;
  allocator<char> local_11b;
  allocator<char> local_11a;
  allocator<char> local_119;
  pointer local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  path local_f0;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  if ((initialize()::dirs_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&initialize()::dirs_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"/usr/lib/",(allocator<char> *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0._M_cmpts,".//usr/local/lib/",&local_11d);
    std::__cxx11::string::string<std::allocator<char>>
              (local_b0,"/usr/local/openssl/lib/",&local_11e);
    std::__cxx11::string::string<std::allocator<char>>(local_90,"/usr/local/ssl/lib/",&local_119);
    std::__cxx11::string::string<std::allocator<char>>(local_70,"/opt/openssl/lib/",&local_11a);
    std::__cxx11::string::string<std::allocator<char>>(local_50,"/lib/",&local_11b);
    __l._M_len = 6;
    __l._M_array = &local_f0._M_pathname;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&initialize()::dirs_abi_cxx11_,__l,&local_11c);
    lVar5 = 0xa0;
    do {
      std::__cxx11::string::~string
                ((string *)((long)&local_f0._M_pathname._M_dataplus._M_p + lVar5));
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,&initialize()::dirs_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&initialize()::dirs_abi_cxx11_);
  }
  __s = getenv("SPONSORYEET_SSL_LIB");
  if (__s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,__s,(allocator<char> *)&local_110);
    bVar2 = attemptOpen(&local_f0._M_pathname);
    std::__cxx11::string::~string((string *)&local_f0);
    if (bVar2) {
      return true;
    }
  }
  if ((initialize()::libs_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&initialize()::libs_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"libssl.so",(allocator<char> *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0._M_cmpts,"libgnutls-openssl.so",&local_11d);
    __l_00._M_len = 2;
    __l_00._M_array = &local_f0._M_pathname;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&initialize()::libs_abi_cxx11_,__l_00,(allocator_type *)&local_11e);
    lVar5 = 0x20;
    do {
      std::__cxx11::string::~string
                ((string *)((long)&local_f0._M_pathname._M_dataplus._M_p + lVar5));
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,&initialize()::libs_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&initialize()::libs_abi_cxx11_);
  }
  local_118 = initialize()::dirs_abi_cxx11_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  __lhs = initialize()::dirs_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    __stream = _stderr;
    pbVar1 = initialize()::libs_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __rhs = initialize()::libs_abi_cxx11_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (__lhs == local_118) {
      uVar4 = dlerror();
      fprintf(__stream,"Failed to find any valid openssl (last error: %s\n)\n",uVar4);
      return false;
    }
    for (; __rhs != pbVar1; __rhs = __rhs + 1) {
      std::operator+(&local_110,__lhs,__rhs);
      std::filesystem::__cxx11::path::path(&local_f0,&local_110,auto_format);
      bVar2 = std::filesystem::exists(&local_f0);
      std::filesystem::__cxx11::path::~path(&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      if (bVar2) {
        std::operator+(&local_f0._M_pathname,__lhs,__rhs);
        bVar2 = attemptOpen(&local_f0._M_pathname);
        std::__cxx11::string::~string((string *)&local_f0);
        if (bVar2) {
          return true;
        }
      }
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

bool initialize()
{
    static const std::vector<std::string> dirs = {
        "/usr/lib/",
        "./"
        "/usr/local/lib/",
        "/usr/local/openssl/lib/",
        "/usr/local/ssl/lib/",
        "/opt/openssl/lib/",
        "/lib/",
    };
    const char *manualPath = getenv("SPONSORYEET_SSL_LIB");
    if (manualPath && attemptOpen(manualPath)) {
        return true;
    }

    // TODO: more?
    static const std::vector<std::string> libs = {
        "libssl.so",
        "libgnutls-openssl.so"
    };
    for (const std::string &dir : dirs) {
        for (const std::string &filename : libs) {
            if (!std::filesystem::exists(dir + filename)) {
                continue;
            }
            if (attemptOpen(dir + filename)) {
                return true;
            }
        }
    }

    fprintf(stderr, "Failed to find any valid openssl (last error: %s\n)\n", dlerror());
    return false;
}